

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O2

void __thiscall TPZShapeData::Print(TPZShapeData *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  int64_t i;
  long lVar3;
  string local_50;
  
  poVar1 = std::operator<<(out,"Shape function type ");
  ShapeFunctionType_abi_cxx11_(&local_50,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_50);
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fPhi,"phi",out,EFormatted);
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fDPhi,"dphi",out,EFormatted);
  poVar1 = std::operator<<(out,"fMasterDirections");
  poVar1 = ::operator<<(poVar1,(TPZMatrix<double> *)&this->fMasterDirections);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements != 0) {
    std::operator<<(out,"VecShapeIndex: ");
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
        lVar3 = lVar3 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (out,*(int *)((long)&((this->fSDVecShapeIndex).
                                               super_TPZVec<std::pair<int,_long>_>.fStore)->first +
                                      lVar2));
      poVar1 = std::operator<<(poVar1,'/');
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::operator<<(poVar1,' ');
      lVar2 = lVar2 + 0x10;
    }
    std::operator<<(out,'\n');
  }
  return;
}

Assistant:

void TPZShapeData::Print(std::ostream &out) const
{
    out << "Shape function type " << ShapeFunctionType() << std::endl;
    fPhi.Print("phi",out);
    fDPhi.Print("dphi",out);
    out << "fMasterDirections" << fMasterDirections << std::endl;
    if (fSDVecShapeIndex.size()) {
        out << "VecShapeIndex: ";
        for (int64_t i = 0; i < fSDVecShapeIndex.size(); i++) {
            out << fSDVecShapeIndex[i].first << '/' << fSDVecShapeIndex[i].second << ' ';
        }
        out << '\n';
    }
}